

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSSpStructMatrix.cpp
# Opt level: O2

TPZStructMatrix * __thiscall
TPZSSpStructMatrix<std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>::Clone
          (TPZSSpStructMatrix<std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
           *this)

{
  TPZStructMatrix *this_00;
  
  this_00 = (TPZStructMatrix *)operator_new(0xc0);
  TPZSSpStructMatrix((TPZSSpStructMatrix<std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
                      *)this_00,this);
  return this_00;
}

Assistant:

TPZStructMatrix * TPZSSpStructMatrix<TVar,TPar>::Clone(){
    return new TPZSSpStructMatrix(*this);
}